

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void duckdb::ModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>::
     Finalize<duckdb::uhugeint_t,duckdb::ModeState<duckdb::uhugeint_t,duckdb::ModeStandard<duckdb::uhugeint_t>>>
               (ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_> *state,
               uhugeint_t *target,AggregateFinalizeData *finalize_data)

{
  ModeStandard<duckdb::uhugeint_t> *this;
  Vector *result;
  bool bVar1;
  pointer pvVar2;
  undefined8 *in_RDX;
  AggregateFinalizeData *in_RSI;
  long in_RDI;
  uhugeint_t uVar3;
  const_iterator highest_frequency;
  unordered_map<duckdb::uhugeint_t,_duckdb::ModeAttr,_std::hash<duckdb::uhugeint_t>,_std::equal_to<duckdb::uhugeint_t>,_std::allocator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>_>_>
  *in_stack_ffffffffffffffa8;
  Vector *local_38;
  AggregateInputData *local_30;
  _Node_iterator_base<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>,_true>
  in_stack_ffffffffffffffd8;
  _Node_iterator_base<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>,_true> local_20;
  undefined8 *local_18;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    AggregateFinalizeData::ReturnNull(in_RSI);
  }
  else {
    local_18 = in_RDX;
    local_20._M_cur =
         (__node_type *)
         ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_>::Scan
                   (in_stack_ffffffffffffffd8._M_cur);
    ::std::
    unordered_map<duckdb::uhugeint_t,_duckdb::ModeAttr,_std::hash<duckdb::uhugeint_t>,_std::equal_to<duckdb::uhugeint_t>,_std::allocator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>_>_>
    ::end(in_stack_ffffffffffffffa8);
    bVar1 = ::std::__detail::operator!=
                      (&local_20,
                       (_Node_iterator_base<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>,_true>
                        *)&stack0xffffffffffffffd8);
    if (bVar1) {
      this = (ModeStandard<duckdb::uhugeint_t> *)*local_18;
      pvVar2 = ::std::__detail::
               _Node_const_iterator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>,_false,_true>
                             *)0x1e113ec);
      result = (Vector *)(pvVar2->first).lower;
      uVar3.upper = (uint64_t)result;
      uVar3.lower = (pvVar2->first).upper;
      uVar3 = ModeStandard<duckdb::uhugeint_t>::Assign<duckdb::uhugeint_t,duckdb::uhugeint_t>
                        (this,result,uVar3);
      local_38 = (Vector *)uVar3.lower;
      in_RSI->result = local_38;
      local_30 = (AggregateInputData *)uVar3.upper;
      in_RSI->input = local_30;
    }
    else {
      AggregateFinalizeData::ReturnNull(in_RSI);
    }
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (!state.frequency_map) {
			finalize_data.ReturnNull();
			return;
		}
		auto highest_frequency = state.Scan();
		if (highest_frequency != state.frequency_map->end()) {
			target = TYPE_OP::template Assign<T, T>(finalize_data.result, highest_frequency->first);
		} else {
			finalize_data.ReturnNull();
		}
	}